

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O3

string * __thiscall
RigidBodyDynamics::Utils::get_dof_name_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,SpatialVector *joint_dof)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  ostream *poVar9;
  char *pcVar10;
  char *pcVar11;
  ostringstream dof_stream;
  Utils *local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  dVar1 = *(double *)this;
  dVar2 = *(double *)(this + 8);
  dVar3 = *(double *)(this + 0x10);
  dVar4 = *(double *)(this + 0x18);
  dVar5 = *(double *)(this + 0x20);
  dVar6 = *(double *)(this + 0x28);
  if (((((dVar1 != 1.0) || (NAN(dVar1))) || (dVar2 != 0.0)) ||
      (((NAN(dVar2) || (dVar3 != 0.0)) || ((NAN(dVar3) || ((dVar4 != 0.0 || (NAN(dVar4))))))))) ||
     ((dVar5 != 0.0 || (((NAN(dVar5) || (dVar6 != 0.0)) || (NAN(dVar6))))))) {
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
LAB_001333d6:
      std::__cxx11::ostringstream::ostringstream(local_190,_S_out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"custom_axis (",0xd);
      local_198 = this;
      poVar9 = Eigen::operator<<((ostream *)local_190,
                                 (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                  *)&local_198);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
      return __return_storage_ptr__;
    }
    if ((((dVar2 != 1.0) || ((NAN(dVar2) || (dVar3 != 0.0)))) || (NAN(dVar3))) ||
       (((((dVar4 != 0.0 || (NAN(dVar4))) || (dVar5 != 0.0)) || ((NAN(dVar5) || (dVar6 != 0.0)))) ||
        (NAN(dVar6))))) {
      if ((((dVar2 != 0.0) || (NAN(dVar2))) ||
          ((dVar3 != 1.0 || (((NAN(dVar3) || (dVar4 != 0.0)) || (NAN(dVar4))))))) ||
         (((dVar5 != 0.0 || (NAN(dVar5))) || ((dVar6 != 0.0 || (NAN(dVar6))))))) {
        bVar7 = dVar3 != 0.0;
        bVar8 = dVar2 != 0.0;
        if ((((bVar8 || bVar7) || (dVar4 != 1.0)) ||
            ((NAN(dVar4) || (((dVar5 != 0.0 || (NAN(dVar5))) || (dVar6 != 0.0)))))) || (NAN(dVar6)))
        {
          if ((((bVar8 || bVar7) || dVar4 != 0.0) || (dVar5 != 1.0)) ||
             ((NAN(dVar5) || ((dVar6 != 0.0 || (NAN(dVar6))))))) {
            if (((((bVar8 || bVar7) || dVar4 != 0.0) || dVar5 != 0.0) || (dVar6 != 1.0)) ||
               (NAN(dVar6))) goto LAB_001333d6;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar11 = "TZ";
            pcVar10 = "";
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar11 = "TY";
            pcVar10 = "";
          }
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar11 = "TX";
          pcVar10 = "";
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "RZ";
        pcVar10 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "RY";
      pcVar10 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "RX";
    pcVar10 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar11,pcVar10);
  return __return_storage_ptr__;
}

Assistant:

string get_dof_name (const SpatialVector &joint_dof)
{
  if (joint_dof == SpatialVector (1., 0., 0., 0., 0., 0.)) {
    return "RX";
  } else if (joint_dof == SpatialVector (0., 1., 0., 0., 0., 0.)) {
    return "RY";
  } else if (joint_dof == SpatialVector (0., 0., 1., 0., 0., 0.)) {
    return "RZ";
  } else if (joint_dof == SpatialVector (0., 0., 0., 1., 0., 0.)) {
    return "TX";
  } else if (joint_dof == SpatialVector (0., 0., 0., 0., 1., 0.)) {
    return "TY";
  } else if (joint_dof == SpatialVector (0., 0., 0., 0., 0., 1.)) {
    return "TZ";
  }

  ostringstream dof_stream(ostringstream::out);
  dof_stream << "custom_axis (" << joint_dof.transpose() << ")";
  return dof_stream.str();
}